

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int lws_header_table_detach(lws *wsi,int autoservice)

{
  int iVar1;
  int n;
  lws_context_per_thread *pt;
  lws_context *context;
  int autoservice_local;
  lws *wsi_local;
  
  iVar1 = __lws_header_table_detach(wsi,autoservice);
  return iVar1;
}

Assistant:

int lws_header_table_detach(struct lws *wsi, int autoservice)
{
	struct lws_context *context = wsi->context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	int n;

	lws_pt_lock(pt, __func__);
	n = __lws_header_table_detach(wsi, autoservice);
	lws_pt_unlock(pt);

	return n;
}